

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O3

void __thiscall ZAP::Archive::buildLookupTable(Archive *this)

{
  uint uVar1;
  char c;
  uint32_t tableSize;
  string filename;
  Entry entry;
  char local_8d;
  uint local_8c;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined8 local_48;
  undefined4 local_40 [2];
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>,std::allocator<std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_38;
  
  std::istream::seekg(this->stream,4,0);
  local_38 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>,std::allocator<std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->lookupTable;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ZAP::Archive::Entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)local_38);
  local_8c = 0;
  std::istream::read((char *)this->stream,(long)&local_8c);
  if (local_8c != 0) {
    uVar1 = 0;
    do {
      local_88 = &local_78;
      local_80 = 0;
      local_78 = 0;
      local_8d = '\0';
      while( true ) {
        std::istream::read((char *)this->stream,(long)&local_8d);
        if (local_8d == '\0') break;
        std::__cxx11::string::push_back((char)&local_88);
      }
      local_68 = &local_58;
      local_60 = 0;
      local_58 = 0;
      local_48 = 0;
      local_40[0] = 0;
      std::__cxx11::string::_M_assign((string *)&local_68);
      std::istream::read((char *)this->stream,(long)&local_48);
      std::istream::read((char *)this->stream,(long)&local_48 + 4);
      std::istream::read((char *)this->stream,(long)local_40);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>,std::allocator<std::pair<std::__cxx11::string_const,ZAP::Archive::Entry>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string&,ZAP::Archive::Entry&>
                (local_38,&local_88,(string *)&local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < local_8c);
  }
  return;
}

Assistant:

void Archive::buildLookupTable()
	{
		// We assume that stream is open
		stream->seekg(TABLE_POS);
		lookupTable.clear();

		std::uint32_t tableSize = 0;
		readField(stream, &tableSize);

		for (uint32_t i = 0; i < tableSize; ++i)
		{
			std::string filename;

			char c = '\0';
			for(;;)
			{
				stream->read(&c, 1);

				if (c == '\0')
					break;

				filename += c;
			}

			Entry entry {};
			entry.virtual_path = filename;
			readField(stream, &entry.index);
			readField(stream, &entry.decompressed_size);
			readField(stream, &entry.compressed_size);

			lookupTable.emplace(filename, entry);
		}
	}